

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000017ff60 = 0x2d2d2d2d2d2d2d;
    uRam000000000017ff67._0_1_ = '-';
    uRam000000000017ff67._1_1_ = '-';
    uRam000000000017ff67._2_1_ = '-';
    uRam000000000017ff67._3_1_ = '-';
    uRam000000000017ff67._4_1_ = '-';
    uRam000000000017ff67._5_1_ = '-';
    uRam000000000017ff67._6_1_ = '-';
    uRam000000000017ff67._7_1_ = '-';
    DAT_0017ff50 = '-';
    DAT_0017ff50_1._0_1_ = '-';
    DAT_0017ff50_1._1_1_ = '-';
    DAT_0017ff50_1._2_1_ = '-';
    DAT_0017ff50_1._3_1_ = '-';
    DAT_0017ff50_1._4_1_ = '-';
    DAT_0017ff50_1._5_1_ = '-';
    DAT_0017ff50_1._6_1_ = '-';
    uRam000000000017ff58 = 0x2d2d2d2d2d2d2d;
    DAT_0017ff5f = 0x2d;
    DAT_0017ff40 = '-';
    DAT_0017ff40_1._0_1_ = '-';
    DAT_0017ff40_1._1_1_ = '-';
    DAT_0017ff40_1._2_1_ = '-';
    DAT_0017ff40_1._3_1_ = '-';
    DAT_0017ff40_1._4_1_ = '-';
    DAT_0017ff40_1._5_1_ = '-';
    DAT_0017ff40_1._6_1_ = '-';
    uRam000000000017ff48._0_1_ = '-';
    uRam000000000017ff48._1_1_ = '-';
    uRam000000000017ff48._2_1_ = '-';
    uRam000000000017ff48._3_1_ = '-';
    uRam000000000017ff48._4_1_ = '-';
    uRam000000000017ff48._5_1_ = '-';
    uRam000000000017ff48._6_1_ = '-';
    uRam000000000017ff48._7_1_ = '-';
    DAT_0017ff30 = '-';
    DAT_0017ff30_1._0_1_ = '-';
    DAT_0017ff30_1._1_1_ = '-';
    DAT_0017ff30_1._2_1_ = '-';
    DAT_0017ff30_1._3_1_ = '-';
    DAT_0017ff30_1._4_1_ = '-';
    DAT_0017ff30_1._5_1_ = '-';
    DAT_0017ff30_1._6_1_ = '-';
    uRam000000000017ff38._0_1_ = '-';
    uRam000000000017ff38._1_1_ = '-';
    uRam000000000017ff38._2_1_ = '-';
    uRam000000000017ff38._3_1_ = '-';
    uRam000000000017ff38._4_1_ = '-';
    uRam000000000017ff38._5_1_ = '-';
    uRam000000000017ff38._6_1_ = '-';
    uRam000000000017ff38._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000017ff28._0_1_ = '-';
    uRam000000000017ff28._1_1_ = '-';
    uRam000000000017ff28._2_1_ = '-';
    uRam000000000017ff28._3_1_ = '-';
    uRam000000000017ff28._4_1_ = '-';
    uRam000000000017ff28._5_1_ = '-';
    uRam000000000017ff28._6_1_ = '-';
    uRam000000000017ff28._7_1_ = '-';
    DAT_0017ff6f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}